

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SetState(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar5;
  AActor *this;
  bool bVar6;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042c3c8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042c3b8:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042c3c8:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x2cd,
                  "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_0042c330;
    pPVar4 = (this->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (this->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042c3c8;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_0042c3b8;
LAB_0042c330:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar1 = param + 1;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_0042c373;
        pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_0042c373:
          bVar6 = AActor::SetState(this,(FState *)(pVVar1->field_0).field_1.a,
                                   param[2].field_0.i != 0);
          if (numret < 1) {
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x2d0,
                            "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = (uint)bVar6;
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x2cf,
                    "int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar5 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x2ce,"int AF_AActor_SetState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetState)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER(state, FState);
	PARAM_BOOL_DEF(nofunction);
	ACTION_RETURN_BOOL(self->SetState(state, nofunction));
}